

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

bool __thiscall capnp::anon_unknown_1::CapnpcCppMain::Slot::operator<(Slot *this,Slot other)

{
  Section SVar1;
  Section SVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint otherStart;
  uint otherBits;
  uint start;
  uint bits;
  Section otherSection;
  Section section;
  Slot *this_local;
  uint uStack_10;
  Slot other_local;
  
  SVar1 = sectionFor(this->whichType);
  this_local._4_2_ = other.whichType;
  SVar2 = sectionFor(this_local._4_2_);
  if ((int)SVar1 < (int)SVar2) {
    other_local._3_1_ = 1;
  }
  else if ((int)SVar2 < (int)SVar1) {
    other_local._3_1_ = 0;
  }
  else if (SVar1 == NONE) {
    other_local._3_1_ = 0;
  }
  else {
    uStack_10 = other.offset;
    if (SVar1 == DATA) {
      uVar3 = typeSizeBits(this->whichType);
      uVar4 = this->offset * uVar3;
      uVar5 = typeSizeBits(this_local._4_2_);
      if (uVar4 < uStack_10 * uVar5) {
        other_local._3_1_ = 1;
      }
      else if (uStack_10 * uVar5 < uVar4) {
        other_local._3_1_ = 0;
      }
      else {
        other_local._3_1_ = uVar5 < uVar3;
      }
    }
    else {
      if (SVar1 != POINTERS) {
        kj::_::unreachable();
      }
      other_local._3_1_ = this->offset < uStack_10;
    }
  }
  return (bool)other_local._3_1_;
}

Assistant:

bool operator<(Slot other) const {
      // Sort by section, then start position, and finally size.

      auto section = sectionFor(whichType);
      auto otherSection = sectionFor(other.whichType);
      if (section < otherSection) {
        return true;
      } else if (section > otherSection) {
        return false;
      }

      switch (section) {
        case Section::NONE:
          return false;
        case Section::DATA: {
          auto bits = typeSizeBits(whichType);
          auto start = offset * bits;
          auto otherBits = typeSizeBits(other.whichType);
          auto otherStart = other.offset * otherBits;
          if (start < otherStart) {
            return true;
          } else if (start > otherStart) {
            return false;
          }

          // Sort larger sizes before smaller.
          return bits > otherBits;
        }
        case Section::POINTERS:
          return offset < other.offset;
      }
      KJ_UNREACHABLE;
    }